

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chan.h
# Opt level: O0

optional<std::function<void_()>_> * __thiscall
dap::Chan<std::function<void_()>_>::take
          (optional<std::function<void_()>_> *__return_storage_ptr__,
          Chan<std::function<void_()>_> *this)

{
  size_type sVar1;
  reference __x;
  undefined1 local_60 [8];
  type out;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  Chan<std::function<void_()>_> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex);
  std::condition_variable::wait<dap::Chan<std::function<void()>>::take()::_lambda()_1_>
            (&this->cv,(unique_lock<std::mutex> *)local_28,(anon_class_8_1_8991fb9c)this);
  sVar1 = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::size(&this->queue);
  if (sVar1 == 0) {
    memset(__return_storage_ptr__,0,0x28);
    optional<std::function<void_()>_>::optional(__return_storage_ptr__);
    out._M_invoker._0_4_ = 1;
  }
  else {
    __x = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::front(&this->queue);
    std::function<void_()>::function((function<void_()> *)local_60,__x);
    std::
    queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::pop(&this->queue);
    optional<std::function<void()>>::optional<std::function<void()>,void>
              ((optional<std::function<void()>> *)__return_storage_ptr__,
               (function<void_()> *)local_60);
    out._M_invoker._0_4_ = 1;
    std::function<void_()>::~function((function<void_()> *)local_60);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

optional<T> Chan<T>::take() {
  std::unique_lock<std::mutex> lock(mutex);
  cv.wait(lock, [&] { return queue.size() > 0 || closed; });
  if (queue.size() == 0) {
    return optional<T>();
  }
  auto out = std::move(queue.front());
  queue.pop();
  return optional<T>(std::move(out));
}